

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCTestResourceSpec.cxx
# Opt level: O1

int testCTestResourceSpec(int argc,char **argv)

{
  _Base_ptr p_Var1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  pointer pEVar6;
  cmCTestResourceSpec *other;
  int iVar7;
  string path;
  string local_e0;
  pointer local_c0;
  char **local_b8;
  cmCTestResourceSpec local_b0;
  
  local_b8 = argv;
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Invalid arguments.\n",0x13);
    iVar7 = -1;
  }
  else {
    local_c0 = expectedResourceSpecs.super__Vector_base<ExpectedSpec,_std::allocator<ExpectedSpec>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (expectedResourceSpecs.super__Vector_base<ExpectedSpec,_std::allocator<ExpectedSpec>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        expectedResourceSpecs.super__Vector_base<ExpectedSpec,_std::allocator<ExpectedSpec>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      iVar7 = 0;
    }
    else {
      p_Var1 = &local_b0.LocalSocket.Resources._M_t._M_impl.super__Rb_tree_header._M_header;
      iVar7 = 0;
      other = &(expectedResourceSpecs.
                super__Vector_base<ExpectedSpec,_std::allocator<ExpectedSpec>_>._M_impl.
                super__Vector_impl_data._M_start)->Expected;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,local_b8[1],(allocator<char> *)&local_b0);
        std::__cxx11::string::append((char *)&local_e0);
        std::__cxx11::string::_M_append
                  ((char *)&local_e0,
                   (ulong)other[-1].parseState.errors.
                          super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cVar2 = other[-1].parseState.doc.field_2._M_local_buf[8];
        local_b0.LocalSocket.Resources._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             _S_red;
        local_b0.LocalSocket.Resources._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        local_b0.parseState.errors.
        super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_b0.parseState.errors.
        super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_b0.parseState.errors.
        super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b0.parseState.parseStack.
        super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b0.parseState.parseStack.
        super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_b0.LocalSocket.Resources._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_b0.parseState.parseStack.
        super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b0.parseState.doc._M_dataplus._M_p = (pointer)&local_b0.parseState.doc.field_2;
        local_b0.parseState.doc._M_string_length = 0;
        local_b0.parseState.doc.field_2._M_local_buf[0] = '\0';
        local_b0.LocalSocket.Resources._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var1
        ;
        local_b0.LocalSocket.Resources._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             p_Var1;
        bVar3 = cmCTestResourceSpec::ReadFromJSONFile(&local_b0,&local_e0);
        if (bVar3 == (bool)cVar2) {
          bVar4 = cmCTestResourceSpec::operator!=(&local_b0,other);
          bVar3 = true;
          if (bVar4) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"ReadFromJSONFile(\"",0x12);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,local_e0._M_dataplus._M_p,
                                local_e0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"\") did not give expected spec",0x1d);
            std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
            goto LAB_001adcf0;
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"ReadFromJSONFile(\"",0x12);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_e0._M_dataplus._M_p,
                              local_e0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\") failed \"",0xb);
          std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
LAB_001adcf0:
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          bVar3 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0.parseState.doc._M_dataplus._M_p != &local_b0.parseState.doc.field_2) {
          operator_delete(local_b0.parseState.doc._M_dataplus._M_p,
                          CONCAT71(local_b0.parseState.doc.field_2._M_allocated_capacity._1_7_,
                                   local_b0.parseState.doc.field_2._M_local_buf[0]) + 1);
        }
        std::vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>::~vector
                  (&local_b0.parseState.errors);
        std::
        vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
        ::~vector(&local_b0.parseState.parseStack);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>
                     *)&local_b0);
        if (!bVar3) {
          iVar7 = -1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        pEVar6 = (pointer)(other + 1);
        other = (cmCTestResourceSpec *)
                &other[1].LocalSocket.Resources._M_t._M_impl.super__Rb_tree_header._M_node_count;
      } while (pEVar6 != local_c0);
    }
  }
  return iVar7;
}

Assistant:

int testCTestResourceSpec(int argc, char** const argv)
{
  if (argc < 2) {
    std::cout << "Invalid arguments.\n";
    return -1;
  }

  int retval = 0;
  for (auto const& spec : expectedResourceSpecs) {
    std::string path = argv[1];
    path += "/testCTestResourceSpec_data/";
    path += spec.Path;
    if (!testSpec(path, spec.ParseResult, spec.Expected)) {
      retval = -1;
    }
  }

  return retval;
}